

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O3

void linfact(lindef *lin)

{
  int iVar1;
  size_t sVar2;
  FILE *pFVar3;
  char *fullname;
  
  sVar2 = strlen((char *)&lin[2].linflg);
  fullname = (char *)((long)&lin[2].linflg + sVar2 + 1);
  if (*fullname == '\0') {
    iVar1 = dbgu_find_src((char *)&lin[2].linflg,(int)sVar2,fullname,0x1000,1);
    if (iVar1 == 0) {
      pFVar3 = (FILE *)0x0;
      goto LAB_00114d1c;
    }
  }
  pFVar3 = fopen(fullname,"r");
LAB_00114d1c:
  lin[1].lingetp = (_func_int_lindef_ptr *)pFVar3;
  return;
}

Assistant:

void linfact(lindef *lin)
{
    char   *fname;
#   define  linf ((linfdef *)lin)

    /* get the name buffer, and advance to the full path name portion */
    fname = linf->linfnam;
    fname += strlen(fname) + 1;

    /*
     *   If the full path name is empty, it means that the UI told us to
     *   defer searching for the file until we actually need the file.  At
     *   this point, we actually need the file.  Ask the UI again to find
     *   the file. 
     */
    if (fname[0] != '\0'
        || dbgu_find_src(linf->linfnam, strlen(linf->linfnam),
                         fname, OSFNMAX, TRUE))
    {
        /* open the file */
        linf->linffp = osfoprs(fname, OSFTTEXT);
    }
    else
    {
        /* there's no file to open */
        linf->linffp = 0;
    }

#   undef linf
}